

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visit.hpp
# Opt level: O1

void mserialize::detail::visit_impl<(anonymous_namespace)::StoreT<double>,InputStream>
               (string_view full_tag,string_view tag,StoreT<double> *visitor,InputStream *istream,
               int max_recursion)

{
  byte __rhs;
  code *pcVar1;
  double dVar2;
  StoreT<double> *visitor_00;
  char extraout_AL;
  bool bVar3;
  char extraout_AL_00;
  char extraout_AL_01;
  char extraout_AL_02;
  char extraout_AL_03;
  char extraout_AL_04;
  char extraout_AL_05;
  char extraout_AL_06;
  char extraout_AL_07;
  char extraout_AL_08;
  char extraout_AL_09;
  char extraout_AL_10;
  char extraout_AL_11;
  char extraout_AL_12;
  char extraout_AL_13;
  char extraout_AL_14;
  char extraout_AL_15;
  char extraout_AL_16;
  char extraout_AL_17;
  char extraout_AL_18;
  char extraout_AL_19;
  char extraout_AL_20;
  char extraout_AL_21;
  char extraout_AL_22;
  char extraout_AL_23;
  char extraout_AL_24;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  long *plVar8;
  runtime_error *prVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  size_t extraout_RDX_04;
  size_t extraout_RDX_05;
  char *pcVar11;
  char cVar12;
  detail *pdVar13;
  ulong uVar14;
  long lVar15;
  detail *pdVar16;
  detail *in_R10;
  ulong uVar17;
  int iVar18;
  detail *pdVar19;
  byte *pbVar20;
  ulong uVar21;
  char *pcVar22;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Da_10;
  undefined4 extraout_XMM0_Da_11;
  undefined4 extraout_XMM0_Da_12;
  undefined4 extraout_XMM0_Da_13;
  undefined4 extraout_XMM0_Da_14;
  undefined4 extraout_XMM0_Da_15;
  undefined4 extraout_XMM0_Da_16;
  undefined4 extraout_XMM0_Da_17;
  undefined4 extraout_XMM0_Da_18;
  undefined4 extraout_XMM0_Da_19;
  undefined4 extraout_XMM0_Da_20;
  undefined4 extraout_XMM0_Da_21;
  undefined4 extraout_XMM0_Da_22;
  undefined4 extraout_XMM0_Da_23;
  undefined4 extraout_XMM0_Da_24;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Db_11;
  undefined4 extraout_XMM0_Db_12;
  undefined4 extraout_XMM0_Db_13;
  undefined4 extraout_XMM0_Db_14;
  undefined4 extraout_XMM0_Db_15;
  undefined4 extraout_XMM0_Db_16;
  undefined4 extraout_XMM0_Db_17;
  undefined4 extraout_XMM0_Db_18;
  undefined4 extraout_XMM0_Db_19;
  undefined4 extraout_XMM0_Db_20;
  undefined4 extraout_XMM0_Db_21;
  undefined4 extraout_XMM0_Db_22;
  undefined4 extraout_XMM0_Db_23;
  undefined4 extraout_XMM0_Db_24;
  string_view full_tag_00;
  string_view full_tag_01;
  string_view full_tag_02;
  string_view full_tag_03;
  string_view full_tag_04;
  string_view full_tag_05;
  string_view tag_00;
  string_view tag_01;
  string_view tag_02;
  string_view tag_03;
  string_view tag_04;
  string_view tag_05;
  string_view tags;
  string_view tags_00;
  string_view tags_01;
  string_view tags_02;
  string_view tags_03;
  string_view tags_04;
  MessageBuilder _DOCTEST_MESSAGE_3;
  uint8_t discriminator;
  double d;
  undefined1 local_d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  ostream *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  ulong local_80;
  pointer local_78;
  StoreT<double> *local_70;
  detail *local_68;
  InputStream *local_60;
  ExpressionDecomposer local_54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  size_t extraout_RDX_03;
  
  uVar5 = tag._len;
  pbVar20 = (byte *)tag._ptr;
  local_80 = full_tag._len;
  full_tag_00._ptr = (detail *)full_tag._ptr;
  if (max_recursion == 0) {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,full_tag_00._ptr,full_tag_00._ptr + local_80);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                   "Recursion limit exceeded while visiting tag: ",&local_a8);
    std::runtime_error::runtime_error(prVar9,(string *)local_d8);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (uVar5 == 0) {
    return;
  }
  __rhs = *pbVar20;
  pdVar19 = (detail *)(ulong)__rhs;
  if (__rhs < 0x3c) {
    if (__rhs == 0x28) {
      pcVar11 = (char *)0x0;
      if (uVar5 != 1) {
        pcVar11 = (char *)(uVar5 - 2);
      }
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x2b,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d8,
                         (double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05));
      if (extraout_AL_05 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
      pdVar19 = (detail *)(pbVar20 + 1);
      doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d8);
      tags_02._len = extraout_RDX_02;
      tags_02._ptr = pcVar11;
      pcVar7 = (char *)tag_first_size(pdVar19,tags_02);
      uVar5 = local_80;
      local_78 = (pointer)CONCAT44(local_78._4_4_,max_recursion);
      if (pcVar7 != (char *)0x0) {
        local_78 = (pointer)CONCAT44(local_78._4_4_,max_recursion + -1);
        pcVar22 = pcVar7;
        if (pcVar11 < pcVar7) {
          pcVar22 = pcVar11;
        }
        pcVar11 = pcVar11 + -(long)pcVar22;
        pdVar13 = (detail *)(pcVar22 + (long)pdVar19);
        do {
          pdVar16 = pdVar13;
          full_tag_03._len = uVar5;
          full_tag_03._ptr = (char *)full_tag_00._ptr;
          tag_03._len = (size_t)pcVar7;
          tag_03._ptr = (char *)pdVar19;
          visit_impl<(anonymous_namespace)::StoreT<double>,InputStream>
                    (full_tag_03,tag_03,visitor,istream,(int)local_78);
          tags_03._len = extraout_RDX_03;
          tags_03._ptr = pcVar11;
          pcVar7 = (char *)tag_first_size(pdVar16,tags_03);
          pcVar22 = pcVar7;
          if (pcVar11 < pcVar7) {
            pcVar22 = pcVar11;
          }
          pcVar11 = pcVar11 + -(long)pcVar22;
          pdVar13 = pdVar16 + (long)pcVar22;
          pdVar19 = pdVar16;
        } while (pcVar7 != (char *)0x0);
      }
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d8,
                         (double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06));
      if (extraout_AL_06 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
      goto LAB_00156bec;
    }
    if (__rhs == 0x2f) {
      pbVar20 = pbVar20 + 1;
      if (uVar5 < 3) {
        lVar15 = 0;
        if (uVar5 != 1) {
          lVar15 = uVar5 - 2;
        }
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,pbVar20,pbVar20 + lVar15);
        std::operator+(&local_a8,"Invalid enum tag: \'",&local_50);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_a8);
        local_d8._0_8_ = *plVar8;
        paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._0_8_ == paVar10) {
          local_c8._M_allocated_capacity = paVar10->_M_allocated_capacity;
          local_c8._8_8_ = plVar8[3];
          local_d8._0_8_ = &local_c8;
        }
        else {
          local_c8._M_allocated_capacity = paVar10->_M_allocated_capacity;
        }
        local_d8._8_8_ = plVar8[1];
        *plVar8 = (long)paVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::runtime_error::runtime_error(prVar9,(string *)local_d8);
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_a8.field_2._8_8_ = local_a8.field_2._M_local_buf + 3;
      visit_arithmetic<mserialize::detail::IntegerToHex,InputStream>
                (*pbVar20,(IntegerToHex *)&local_a8,istream);
      *(char *)(local_a8.field_2._8_8_ + -1) = '\'';
      local_a8.field_2._M_local_buf[3] = '`';
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d8,
                         (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
      if (extraout_AL_02 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
      goto LAB_00156bec;
    }
  }
  else {
    if (__rhs == 0x3c) {
      pdVar19 = (detail *)(pbVar20 + 1);
      pcVar11 = (char *)0x0;
      if (uVar5 != 1) {
        pcVar11 = (char *)(uVar5 - 2);
      }
      local_68 = full_tag_00._ptr;
      std::istream::read((char *)istream->stream,(long)&local_a8);
      sVar4 = extraout_RDX_00;
      for (cVar12 = (char)local_a8._M_dataplus._M_p; cVar12 != '\0'; cVar12 = cVar12 + -1) {
        tags_00._len = sVar4;
        tags_00._ptr = pcVar11;
        pcVar7 = (char *)tag_first_size(pdVar19,tags_00);
        if (pcVar11 < pcVar7) {
          pcVar7 = pcVar11;
        }
        pdVar19 = pdVar19 + (long)pcVar7;
        pcVar11 = pcVar11 + -(long)pcVar7;
        sVar4 = extraout_RDX_01;
      }
      tags_01._len = sVar4;
      tags_01._ptr = pcVar11;
      sVar4 = tag_first_size(pdVar19,tags_01);
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x2b,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
      uVar5 = local_80;
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d8,
                         (double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
      if (extraout_AL_03 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
      doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d8);
      if ((sVar4 == 1) && (iVar18 = bcmp(pdVar19,"0",1), iVar18 == 0)) {
        doctest::detail::MessageBuilder::MessageBuilder
                  ((MessageBuilder *)local_d8,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
        dVar2 = doctest::detail::MessageBuilder::log
                          ((MessageBuilder *)local_d8,
                           (double)CONCAT44(extraout_XMM0_Db_14,extraout_XMM0_Da_14));
        if (extraout_AL_14 != '\0') {
          pcVar1 = (code *)swi(3);
          (*pcVar1)(SUB84(dVar2,0));
          return;
        }
        doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
        doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d8);
      }
      else {
        full_tag_02._len = uVar5;
        full_tag_02._ptr = (char *)local_68;
        tag_02._len = sVar4;
        tag_02._ptr = (char *)pdVar19;
        visit_impl<(anonymous_namespace)::StoreT<double>,InputStream>
                  (full_tag_02,tag_02,visitor,istream,max_recursion + -1);
      }
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d8,
                         (double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
      if (extraout_AL_04 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
      goto LAB_00156bec;
    }
    if (__rhs == 0x7b) {
      uVar21 = uVar5 - 1;
      if (uVar5 == 0) {
        uVar21 = 0;
      }
      uVar6 = 0;
      if (uVar5 - 1 != 0) {
        uVar5 = 0;
        do {
          uVar6 = uVar5;
          if (pbVar20[uVar5] == 0x60) break;
          uVar5 = uVar5 + 1;
          uVar6 = uVar21;
        } while (uVar21 != uVar5);
      }
      uVar5 = uVar6;
      if (uVar21 < uVar6) {
        uVar5 = uVar21;
      }
      uVar21 = uVar21 - uVar5;
      if (uVar21 == 0) {
        uVar5 = local_80;
        pdVar13 = full_tag_00._ptr;
        if (uVar6 != 0) {
          do {
            if (uVar5 == 0) goto LAB_00156a1a;
            uVar14 = uVar5;
            pdVar16 = pdVar13;
            do {
              uVar17 = 0;
              do {
                if (uVar14 == uVar17) {
                  bVar3 = false;
                  in_R10 = pdVar13 + uVar5;
                  goto LAB_00156977;
                }
                if (pdVar16[uVar17] != *(detail *)(pbVar20 + uVar17)) {
                  bVar3 = true;
                  goto LAB_00156977;
                }
                uVar17 = uVar17 + 1;
              } while (uVar6 != uVar17);
              bVar3 = false;
              in_R10 = pdVar16;
LAB_00156977:
              pdVar16 = pdVar16 + 1;
              uVar14 = uVar14 - 1;
            } while (bVar3);
            uVar14 = (long)in_R10 - (long)pdVar13;
            if (in_R10 == pdVar13 + uVar5) {
              uVar14 = 0xffffffffffffffff;
            }
            if (uVar5 < uVar14) {
              uVar14 = uVar5;
            }
            uVar5 = uVar5 - uVar14;
            uVar17 = uVar6;
            if (uVar5 < uVar6) {
              uVar17 = uVar5;
            }
            pdVar13 = pdVar13 + uVar17 + uVar14;
            iVar18 = 3;
            uVar5 = uVar5 - uVar17;
            if ((uVar5 != 0) && (*pdVar13 != (detail)0x7d)) {
              if (*pdVar13 == (detail)0x60) {
                iVar18 = 1;
                pdVar19 = pdVar13;
                if (uVar5 == 1) {
                  uVar21 = 0;
                }
                else {
                  uVar21 = 1;
                  lVar15 = 1;
                  do {
                    if (pdVar13[uVar21] == (detail)0x7d) {
                      lVar15 = lVar15 + -1;
                      if (lVar15 == 0) goto LAB_00156a0d;
                    }
                    else if (pdVar13[uVar21] == (detail)0x7b) {
                      lVar15 = lVar15 + 1;
                    }
                    uVar21 = uVar21 + 1;
                  } while (uVar5 != uVar21);
                  uVar21 = uVar5 - 1;
                }
              }
              else {
                iVar18 = 0;
              }
            }
LAB_00156a0d:
          } while (iVar18 == 0);
          if (iVar18 == 1) goto LAB_00156a1f;
        }
LAB_00156a1a:
        pdVar19 = (detail *)0x0;
        uVar21 = 0;
      }
      else {
        pdVar19 = (detail *)(pbVar20 + uVar5);
      }
LAB_00156a1f:
      local_70 = visitor;
      local_68 = full_tag_00._ptr;
      local_60 = istream;
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x2b,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d8,
                         (double)CONCAT44(extraout_XMM0_Db_10,extraout_XMM0_Da_10));
      if (extraout_AL_10 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
      doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d8);
      if (uVar21 != 0) {
        sVar4 = extraout_RDX_04;
        do {
          uVar21 = uVar21 - 1;
          if (uVar21 == 0) {
            uVar5 = 1;
          }
          else {
            uVar6 = 0;
            do {
              uVar5 = uVar6;
              if (pdVar19[uVar6 + 1] == (detail)0x27) break;
              uVar6 = uVar6 + 1;
              uVar5 = uVar21;
            } while (uVar21 != uVar6);
            uVar5 = uVar5 + 1;
          }
          if (uVar21 < uVar5) {
            uVar5 = uVar21;
          }
          pdVar19 = pdVar19 + uVar5 + 1;
          pcVar22 = (char *)(uVar21 - uVar5);
          tags_04._len = sVar4;
          tags_04._ptr = pcVar22;
          pcVar7 = (char *)tag_first_size(pdVar19,tags_04);
          pcVar11 = pcVar7;
          if (pcVar22 < pcVar7) {
            pcVar11 = pcVar22;
          }
          doctest::detail::MessageBuilder::MessageBuilder
                    ((MessageBuilder *)local_d8,
                     "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                     ,0x28,is_require);
          std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
          dVar2 = doctest::detail::MessageBuilder::log
                            ((MessageBuilder *)local_d8,
                             (double)CONCAT44(extraout_XMM0_Db_11,extraout_XMM0_Da_11));
          if (extraout_AL_11 != '\0') {
            pcVar1 = (code *)swi(3);
            (*pcVar1)(SUB84(dVar2,0));
            return;
          }
          doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
          doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d8);
          full_tag_05._len = local_80;
          full_tag_05._ptr = (char *)local_68;
          tag_05._len = (size_t)pcVar7;
          tag_05._ptr = (char *)pdVar19;
          visit_impl<(anonymous_namespace)::StoreT<double>,InputStream>
                    (full_tag_05,tag_05,local_70,local_60,max_recursion + -1);
          doctest::detail::MessageBuilder::MessageBuilder
                    ((MessageBuilder *)local_d8,
                     "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                     ,0x28,is_require);
          std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
          dVar2 = doctest::detail::MessageBuilder::log
                            ((MessageBuilder *)local_d8,
                             (double)CONCAT44(extraout_XMM0_Db_12,extraout_XMM0_Da_12));
          if (extraout_AL_12 != '\0') {
            pcVar1 = (code *)swi(3);
            (*pcVar1)(SUB84(dVar2,0));
            return;
          }
          doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
          pdVar19 = pdVar19 + (long)pcVar11;
          uVar21 = (long)pcVar22 - (long)pcVar11;
          doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d8);
          sVar4 = extraout_RDX_05;
        } while (uVar21 != 0);
      }
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d8,
                         (double)CONCAT44(extraout_XMM0_Db_13,extraout_XMM0_Da_13));
      if (extraout_AL_13 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
      goto LAB_00156bec;
    }
    if (__rhs == 0x5b) {
      pdVar19 = (detail *)(pbVar20 + 1);
      local_70 = visitor;
      std::istream::read((char *)istream->stream,(long)&local_a8);
      tags._len = extraout_RDX;
      tags._ptr = (char *)(uVar5 - 1);
      sVar4 = tag_first_size(pdVar19,tags);
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x2b,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
      uVar5 = local_80;
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d8,
                         (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
      if (extraout_AL != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
      iVar18 = max_recursion + -1;
      doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d8);
      if (((uint)local_a8._M_dataplus._M_p < 0x21) ||
         (full_tag_00._len = uVar5, tag_00._len = sVar4, tag_00._ptr = (char *)pdVar19,
         bVar3 = singular_impl(full_tag_00,tag_00,iVar18), !bVar3)) {
        visitor_00 = local_70;
        bVar3 = (uint)local_a8._M_dataplus._M_p != 0;
        local_a8._M_dataplus._M_p._0_4_ = (uint)local_a8._M_dataplus._M_p + -1;
        if (bVar3) {
          local_78 = (pointer)CONCAT44(local_78._4_4_,iVar18);
          do {
            full_tag_04._len = uVar5;
            full_tag_04._ptr = (char *)full_tag_00._ptr;
            tag_04._len = sVar4;
            tag_04._ptr = (char *)pdVar19;
            visit_impl<(anonymous_namespace)::StoreT<double>,InputStream>
                      (full_tag_04,tag_04,visitor_00,istream,iVar18);
            bVar3 = (uint)local_a8._M_dataplus._M_p != 0;
            local_a8._M_dataplus._M_p._0_4_ = (uint)local_a8._M_dataplus._M_p + -1;
            iVar18 = (int)local_78;
          } while (bVar3);
        }
      }
      else {
        doctest::detail::MessageBuilder::MessageBuilder
                  ((MessageBuilder *)local_d8,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        uVar5 = local_80;
        std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
        dVar2 = doctest::detail::MessageBuilder::log
                          ((MessageBuilder *)local_d8,
                           (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
        if (extraout_AL_00 != '\0') {
          pcVar1 = (code *)swi(3);
          (*pcVar1)(SUB84(dVar2,0));
          return;
        }
        doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
        doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d8);
        full_tag_01._len = uVar5;
        full_tag_01._ptr = (char *)full_tag_00._ptr;
        tag_01._len = sVar4;
        tag_01._ptr = (char *)pdVar19;
        visit_impl<(anonymous_namespace)::StoreT<double>,InputStream>
                  (full_tag_01,tag_01,local_70,istream,iVar18);
        doctest::detail::MessageBuilder::MessageBuilder
                  ((MessageBuilder *)local_d8,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
        dVar2 = doctest::detail::MessageBuilder::log
                          ((MessageBuilder *)local_d8,
                           (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
        if (extraout_AL_01 != '\0') {
          pcVar1 = (code *)swi(3);
          (*pcVar1)(SUB84(dVar2,0));
          return;
        }
        doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
        doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d8);
      }
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d8,
                         (double)CONCAT44(extraout_XMM0_Db_08,extraout_XMM0_Da_08));
      if (extraout_AL_08 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
      goto LAB_00156bec;
    }
  }
  if (__rhs < 0x62) {
    if (__rhs < 0x49) {
      if (__rhs == 0x42) {
        std::istream::read((char *)istream->stream,(long)&local_a8);
        doctest::detail::MessageBuilder::MessageBuilder
                  ((MessageBuilder *)local_d8,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
        dVar2 = doctest::detail::MessageBuilder::log
                          ((MessageBuilder *)local_d8,
                           (double)CONCAT44(extraout_XMM0_Db_23,extraout_XMM0_Da_23));
        if (extraout_AL_23 != '\0') {
          pcVar1 = (code *)swi(3);
          (*pcVar1)(SUB84(dVar2,0));
          return;
        }
        doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
      }
      else {
        if (__rhs != 0x44) goto switchD_00156791_caseD_65;
        std::istream::read((char *)istream->stream,(long)&local_a8);
        doctest::detail::MessageBuilder::MessageBuilder
                  ((MessageBuilder *)local_d8,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
        dVar2 = doctest::detail::MessageBuilder::log
                          ((MessageBuilder *)local_d8,
                           (double)CONCAT44(extraout_XMM0_Db_16,extraout_XMM0_Da_16));
        if (extraout_AL_16 != '\0') {
          pcVar1 = (code *)swi(3);
          (*pcVar1)(SUB84(dVar2,0));
          return;
        }
        doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
      }
    }
    else if (__rhs == 0x49) {
      std::istream::read((char *)istream->stream,(long)&local_a8);
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d8,
                         (double)CONCAT44(extraout_XMM0_Db_22,extraout_XMM0_Da_22));
      if (extraout_AL_22 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
    }
    else if (__rhs == 0x4c) {
      std::istream::read((char *)istream->stream,(long)&local_a8);
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d8,
                         (double)CONCAT44(extraout_XMM0_Db_21,extraout_XMM0_Da_21));
      if (extraout_AL_21 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
    }
    else {
      if (__rhs != 0x53) goto switchD_00156791_caseD_65;
      std::istream::read((char *)istream->stream,(long)&local_a8);
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d8,
                         (double)CONCAT44(extraout_XMM0_Db_09,extraout_XMM0_Da_09));
      if (extraout_AL_09 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
    }
  }
  else {
    switch(__rhs) {
    case 0x62:
      std::istream::read((char *)istream->stream,(long)&local_a8);
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d8,
                         (double)CONCAT44(extraout_XMM0_Db_07,extraout_XMM0_Da_07));
      if (extraout_AL_07 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
      break;
    case 99:
      std::istream::read((char *)istream->stream,(long)&local_a8);
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d8,
                         (double)CONCAT44(extraout_XMM0_Db_17,extraout_XMM0_Da_17));
      if (extraout_AL_17 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
      break;
    case 100:
      std::istream::read((char *)istream->stream,(long)&local_50);
      local_78 = local_50._M_dataplus._M_p;
      doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_54,DT_CHECK);
      local_a8._M_dataplus._M_p =
           (pointer)((ulong)local_54.m_at << 0x20 | (ulong)visitor->_has_visit ^ 1);
      doctest::detail::Expression_lhs::operator_cast_to_Result
                ((Result *)local_d8,(Expression_lhs *)&local_a8);
      doctest::detail::decomp_assert
                ((detail *)0xa,0x1b93e8,(char *)0x22,0x1babc4,(char *)local_d8,(Result *)istream);
      doctest::String::~String((String *)(local_d8 + 8));
      visitor->_has_visit = true;
      visitor->_value = (double)local_78;
      return;
    case 0x65:
    case 0x67:
    case 0x68:
    case 0x6a:
    case 0x6b:
switchD_00156791_caseD_65:
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,"Invalid arithmetic tag: ","");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                     &local_a8,__rhs);
      std::runtime_error::runtime_error(prVar9,(string *)local_d8);
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    case 0x66:
      std::istream::read((char *)istream->stream,(long)&local_a8);
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d8,
                         (double)CONCAT44(extraout_XMM0_Db_19,extraout_XMM0_Da_19));
      if (extraout_AL_19 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
      break;
    case 0x69:
      std::istream::read((char *)istream->stream,(long)&local_a8);
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d8,
                         (double)CONCAT44(extraout_XMM0_Db_20,extraout_XMM0_Da_20));
      if (extraout_AL_20 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
      break;
    case 0x6c:
      std::istream::read((char *)istream->stream,(long)&local_a8);
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d8,
                         (double)CONCAT44(extraout_XMM0_Db_18,extraout_XMM0_Da_18));
      if (extraout_AL_18 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
      break;
    default:
      if (__rhs == 0x73) {
        std::istream::read((char *)istream->stream,(long)&local_a8);
        doctest::detail::MessageBuilder::MessageBuilder
                  ((MessageBuilder *)local_d8,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
        dVar2 = doctest::detail::MessageBuilder::log
                          ((MessageBuilder *)local_d8,
                           (double)CONCAT44(extraout_XMM0_Db_24,extraout_XMM0_Da_24));
        if (extraout_AL_24 != '\0') {
          pcVar1 = (code *)swi(3);
          (*pcVar1)(SUB84(dVar2,0));
          return;
        }
        doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
      }
      else {
        if (__rhs != 0x79) goto switchD_00156791_caseD_65;
        std::istream::read((char *)istream->stream,(long)&local_a8);
        doctest::detail::MessageBuilder::MessageBuilder
                  ((MessageBuilder *)local_d8,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        std::__ostream_insert<char,std::char_traits<char>>(local_b0,"Unexpected visit of U",0x15);
        dVar2 = doctest::detail::MessageBuilder::log
                          ((MessageBuilder *)local_d8,
                           (double)CONCAT44(extraout_XMM0_Db_15,extraout_XMM0_Da_15));
        if (extraout_AL_15 != '\0') {
          pcVar1 = (code *)swi(3);
          (*pcVar1)(SUB84(dVar2,0));
          return;
        }
        doctest::detail::MessageBuilder::react((MessageBuilder *)local_d8);
      }
    }
  }
LAB_00156bec:
  doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d8);
  return;
}

Assistant:

void visit_impl(const string_view full_tag, string_view tag, Visitor& visitor, InputStream& istream, int max_recursion)
{
  if (max_recursion == 0) { throw std::runtime_error("Recursion limit exceeded while visiting tag: " + full_tag.to_string()); }

  if (tag.empty()) { return; }

  switch (tag.front())
  {
  case '[':
    visit_sequence(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '(':
    visit_tuple(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '<':
    visit_variant(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '{':
    visit_struct(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '/':
    visit_enum(tag, visitor, istream);
    break;
  default:
    visit_arithmetic(tag.front(), visitor, istream);
  }
}